

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,4u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  Char CVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  Type *pTVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint *puVar13;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_00;
  ulong uVar14;
  undefined4 in_register_0000008c;
  ulong uVar15;
  uint k;
  int iVar16;
  Type local_a4;
  ulong uStack_a0;
  int lastOcc_1;
  ulong local_98;
  ulong local_90;
  undefined4 *local_88;
  ulong local_80;
  int *local_78;
  ulong local_70;
  int local_64;
  TextbookBoyerMoore<char16_t> *local_60;
  uint local_58;
  int local_54;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *pCStack_50;
  int lastOcc;
  ulong local_48;
  uint *local_40;
  uint local_34;
  
  local_60 = this;
  local_40 = inputOffset;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar3) goto LAB_00f1a259;
    *puVar7 = 0;
  }
  if (inputLength < *local_40) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar3) {
LAB_00f1a259:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  if (patLen <= inputLength) {
    uVar11 = *local_40;
    local_48 = (ulong)(patLen - 1);
    uVar10 = inputLength - (patLen - 1);
    uVar15 = CONCAT44(in_register_0000008c,patLen);
    local_88 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if (uVar11 < uVar10) {
      local_78 = (local_60->goodSuffix).ptr;
      this_00 = &local_60->lastOccurrence;
      local_80 = (ulong)(patLen * 4 - 4);
      uStack_a0 = (ulong)(patLen * 4 - 3);
      local_98 = (ulong)(patLen * 4 - 2);
      local_90 = (ulong)(patLen * 4 - 1);
      local_64 = patLen - 2;
      uVar8 = local_80;
      puVar13 = local_40;
      uVar14 = local_48;
      local_70 = CONCAT44(in_register_0000008c,patLen);
      local_58 = uVar10;
      pCStack_50 = this_00;
      do {
        do {
          CVar1 = input[uVar11 + (int)uVar14];
          cVar4 = '\t';
          if ((((pat[uVar8] != CVar1) && (pat[uStack_a0] != CVar1)) && (pat[local_98] != CVar1)) &&
             (pat[local_90] != CVar1)) {
            local_34 = (uint)uVar15;
            k = (uint)(ushort)CVar1;
            if (k < 0x100) {
              BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (this_00,k);
              if (BVar5 == 0) goto LAB_00f1a0df;
              local_54 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                   (pCStack_50,k);
LAB_00f1a04f:
              if ((int)local_48 - local_54 < local_78[local_48]) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = local_88;
                *local_88 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                   ,0xeb,
                                   "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                   ,
                                   "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                  );
                if (!bVar3) goto LAB_00f1a259;
                *puVar7 = 0;
              }
              uVar11 = ((int)local_48 - local_54) + uVar11;
              bVar3 = uVar11 < uVar10;
              cVar4 = !bVar3;
            }
            else {
              bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (this_00,k,&local_54);
              if (bVar3) goto LAB_00f1a04f;
LAB_00f1a0df:
              uVar11 = uVar11 + (int)local_70;
              bVar3 = uVar11 < uVar10;
              cVar4 = '\x01';
              if (bVar3) {
                cVar4 = '\b';
              }
            }
            uVar15 = (ulong)CONCAT31((int3)(local_34 >> 8),(byte)local_34 & bVar3);
            uVar8 = local_80;
            puVar13 = local_40;
            this_00 = pCStack_50;
            uVar14 = local_48;
          }
        } while ((cVar4 == '\0') || (cVar4 == '\b'));
        if (cVar4 != '\t') goto LAB_00f1a23c;
        iVar16 = local_64;
        if (uVar14 == 0) {
          *puVar13 = uVar11;
          uVar15 = 1;
          goto LAB_00f1a23c;
        }
        do {
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          CVar1 = input[uVar11 + iVar16];
          uVar10 = iVar16 * 4;
          if (((pat[uVar10] == CVar1) || (pat[(ulong)uVar10 + 1] == CVar1)) ||
             ((pat[(ulong)uVar10 + 2] == CVar1 || (pat[(ulong)uVar10 + 3] == CVar1)))) {
            iVar16 = iVar16 + -1;
            if (iVar16 < 0) {
              *puVar13 = uVar11;
              uVar15 = CONCAT71((int7)(uVar15 >> 8),1);
              iVar6 = 1;
              bVar3 = false;
            }
            else {
              iVar6 = 0;
              bVar3 = true;
            }
          }
          else {
            local_34 = (uint)uVar15;
            uVar10 = (uint)(ushort)CVar1;
            if (uVar10 < 0x100) {
              BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (this_00,uVar10);
              if (BVar5 == 0) {
                iVar6 = (local_60->lastOccurrence).defv;
              }
              else {
                iVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                  (pCStack_50,uVar10);
              }
            }
            else {
              bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (this_00,uVar10,&local_a4);
              pTVar9 = &(local_60->lastOccurrence).defv;
              if (bVar3) {
                pTVar9 = &local_a4;
              }
              iVar6 = *pTVar9;
            }
            uVar15 = (ulong)local_34;
            iVar12 = iVar16 - iVar6;
            if (iVar16 - iVar6 <= local_78[iVar16]) {
              iVar12 = local_78[iVar16];
            }
            uVar11 = iVar12 + uVar11;
            iVar6 = 0xd;
            bVar3 = false;
            puVar13 = local_40;
            this_00 = pCStack_50;
            uVar14 = local_48;
          }
        } while (iVar6 == 0);
        if ((iVar6 != 0xd) && (!bVar3)) goto LAB_00f1a23c;
        uVar8 = local_80;
        uVar10 = local_58;
      } while (uVar11 < local_58);
    }
  }
  uVar15 = 0;
LAB_00f1a23c:
  return (bool)((byte)uVar15 & 1);
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }